

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O0

void ParseConstant(FScanner *sc,PSymbolTable *symt,PClassActor *cls)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  PSymbolConstNumeric *pPVar4;
  PSymbol *pPVar5;
  char *pcVar6;
  anon_union_8_3_addc324a_for_ExpVal_1 len;
  double dVar7;
  char *local_b0;
  FName local_5c;
  FName local_58 [4];
  PSymbolConstNumeric *local_48;
  PSymbolConstNumeric *sym;
  ExpVal val;
  FxExpression *expr;
  FName symname;
  int type;
  PClassActor *cls_local;
  PSymbolTable *symt_local;
  FScanner *sc_local;
  
  _symname = cls;
  bVar1 = FScanner::CheckToken(sc,0x140);
  if ((bVar1) || (bVar1 = FScanner::CheckToken(sc,0x134), bVar1)) {
    expr._4_4_ = sc->TokenType;
    FScanner::MustGetToken(sc,0x101);
    FName::FName((FName *)&expr,sc->String);
    FScanner::MustGetToken(sc,0x3d);
    val.field_1.pointer = ParseExpression(sc,_symname,true);
    FScanner::MustGetToken(sc,0x3b);
    if (val.field_1.pointer == (void *)0x0) {
      FScanner::ScriptMessage(sc,"Error while resolving constant definition");
      FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
    }
    else {
      uVar3 = (**(code **)(*val.field_1.pointer + 0x18))();
      if ((uVar3 & 1) == 0) {
        FScanner::ScriptMessage(sc,"Constant definition is not a constant");
        FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
      }
      else {
        len = val.field_1;
        FxConstant::GetValue((FxConstant *)&sym);
        if (val.field_1.pointer != (void *)0x0) {
          (**(code **)(*val.field_1.pointer + 8))();
        }
        if (expr._4_4_ == 0x140) {
          pPVar4 = (PSymbolConstNumeric *)DObject::operator_new((DObject *)0x38,(size_t)len);
          FName::FName(local_58,(FName *)&expr);
          PSymbolConstNumeric::PSymbolConstNumeric(pPVar4,local_58,(PType *)TypeSInt32);
          local_48 = pPVar4;
          iVar2 = ExpVal::GetInt((ExpVal *)&sym);
          (local_48->field_0).Value = iVar2;
        }
        else {
          pPVar4 = (PSymbolConstNumeric *)DObject::operator_new((DObject *)0x38,(size_t)len);
          FName::FName(&local_5c,(FName *)&expr);
          PSymbolConstNumeric::PSymbolConstNumeric(pPVar4,&local_5c,(PType *)TypeFloat64);
          local_48 = pPVar4;
          dVar7 = ExpVal::GetFloat((ExpVal *)&sym);
          (local_48->field_0).Float = dVar7;
        }
        pPVar5 = PSymbolTable::AddSymbol(symt,(PSymbol *)local_48);
        if (pPVar5 == (PSymbol *)0x0) {
          if (local_48 != (PSymbolConstNumeric *)0x0) {
            (*(local_48->super_PSymbolConst).super_PSymbol.super_PTypeBase.super_DObject.
              _vptr_DObject[2])();
          }
          pcVar6 = FName::GetChars((FName *)&expr);
          if (_symname == (PClassActor *)0x0) {
            local_b0 = "Global";
          }
          else {
            local_b0 = FName::GetChars(&(_symname->super_PClass).super_PNativeStruct.super_PStruct.
                                        super_PNamedType.TypeName);
          }
          FScanner::ScriptMessage(sc,"\'%s\' is already defined in \'%s\'.",pcVar6,local_b0);
          FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
        }
        ExpVal::~ExpVal((ExpVal *)&sym);
      }
    }
  }
  else {
    FScanner::ScriptMessage(sc,"Numeric type required for constant");
    FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
  }
  return;
}

Assistant:

static void ParseConstant (FScanner &sc, PSymbolTable *symt, PClassActor *cls)
{
	// Read the type and make sure it's int or float.
	if (sc.CheckToken(TK_Int) || sc.CheckToken(TK_Float))
	{
		int type = sc.TokenType;
		sc.MustGetToken(TK_Identifier);
		FName symname = sc.String;
		sc.MustGetToken('=');
		FxExpression *expr = ParseExpression (sc, cls, true);
		sc.MustGetToken(';');

		if (expr == nullptr)
		{
			sc.ScriptMessage("Error while resolving constant definition");
			FScriptPosition::ErrorCounter++;
		}
		else if (!expr->isConstant())
		{
			sc.ScriptMessage("Constant definition is not a constant");
			FScriptPosition::ErrorCounter++;
		}
		else
		{
			ExpVal val = static_cast<FxConstant *>(expr)->GetValue();
			delete expr;
			PSymbolConstNumeric *sym;
			if (type == TK_Int)
			{
				sym = new PSymbolConstNumeric(symname, TypeSInt32);
				sym->Value = val.GetInt();
			}
			else
			{
				sym = new PSymbolConstNumeric(symname, TypeFloat64);
				sym->Float = val.GetFloat();
			}
			if (symt->AddSymbol (sym) == NULL)
			{
				delete sym;
				sc.ScriptMessage ("'%s' is already defined in '%s'.",
					symname.GetChars(), cls? cls->TypeName.GetChars() : "Global");
				FScriptPosition::ErrorCounter++;
			}
		}
	}
	else
	{
		sc.ScriptMessage("Numeric type required for constant");
		FScriptPosition::ErrorCounter++;
	}
}